

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::_first_real_span_hex(basic_substring<const_char> *this,size_t pos)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  error_flags eVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong unaff_R15;
  basic_substring<const_char> bVar11;
  char *local_50;
  basic_substring<const_char> local_40;
  
  uVar10 = this->len;
  if (pos < uVar10) {
    bVar4 = false;
    do {
      bVar1 = this->str[pos];
      if ((byte)(bVar1 - 0x30) < 10) {
LAB_001db9c2:
        iVar9 = 0;
        bVar4 = true;
      }
      else {
        uVar7 = bVar1 - 0x2e;
        if (uVar7 < 0x39) {
          if ((0x1f8000001f80000U >> ((ulong)uVar7 & 0x3f) & 1) != 0) goto LAB_001db9c2;
          if ((ulong)uVar7 != 0) goto LAB_001db9f2;
          pos = pos + 1;
          iVar9 = 5;
        }
        else {
LAB_001db9f2:
          if ((bVar1 & 0xdf) == 0x50) {
            pos = pos + 1;
            iVar9 = 6;
          }
          else {
            iVar9 = 1;
            if (((((bVar1 < 0x3c) && ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
                 (bVar1 == 0x7d)) || (bVar1 == 0x5d)) && (bVar4)) {
              if (pos != 0xffffffffffffffff && uVar10 < pos) {
                eVar5 = get_error_flags();
                if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                  pcVar2 = (code *)swi(3);
                  bVar11 = (basic_substring<const_char>)(*pcVar2)();
                  return bVar11;
                }
                handle_error(0x24a7ca,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             ,0x154e,"num <= len || num == npos");
              }
              sVar6 = pos;
              if (pos == 0xffffffffffffffff) {
                sVar6 = this->len;
              }
              basic_substring(&local_40,this->str,sVar6);
              unaff_R15 = local_40.len;
              local_50 = local_40.str;
            }
            else {
              unaff_R15 = 0;
              local_50 = this->str;
            }
          }
        }
      }
      if (iVar9 != 0) {
        if (iVar9 != 5) {
          if (iVar9 != 6) goto LAB_001dbabd;
          bVar3 = false;
          goto LAB_001dbaec;
        }
        if (pos == 0) {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar2 = (code *)swi(3);
            bVar11 = (basic_substring<const_char>)(*pcVar2)();
            return bVar11;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x193f,"pos > 0");
        }
        if (this->str[pos - 1] != '.') {
          eVar5 = get_error_flags();
          if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
            pcVar2 = (code *)swi(3);
            bVar11 = (basic_substring<const_char>)(*pcVar2)();
            return bVar11;
          }
          handle_error(0x24a7ca,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1940,"str[pos - 1] == \'.\'");
        }
        uVar10 = this->len;
        if (uVar10 <= pos) {
          bVar3 = false;
          goto LAB_001dbd98;
        }
        bVar3 = false;
        goto LAB_001dbc4f;
      }
      pos = pos + 1;
      uVar10 = this->len;
    } while (pos < uVar10);
    unaff_R15 = 0;
    if (bVar4) {
      unaff_R15 = uVar10;
    }
  }
  else {
    unaff_R15 = 0;
  }
  local_50 = this->str;
  goto LAB_001dbabd;
  while( true ) {
    pos = pos + 1;
    uVar10 = this->len;
    if (uVar10 <= pos) break;
LAB_001dbc4f:
    bVar1 = this->str[pos];
    if ((byte)(bVar1 - 0x30) < 10) {
LAB_001dbc70:
      iVar9 = 0;
      bVar3 = true;
    }
    else {
      if ((bVar1 - 0x41 < 0x26) && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))
      goto LAB_001dbc70;
      if ((bVar1 & 0xdf) == 0x50) {
        pos = pos + 1;
        iVar9 = 6;
      }
      else {
        iVar9 = 1;
        if (((((bVar1 < 0x3c) && ((0x800120100002601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
             (bVar1 == 0x7d)) || (bVar1 == 0x5d)) && ((bVar4 || (bVar3)))) {
          if (pos != 0xffffffffffffffff && uVar10 < pos) {
            eVar5 = get_error_flags();
            if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
              pcVar2 = (code *)swi(3);
              bVar11 = (basic_substring<const_char>)(*pcVar2)();
              return bVar11;
            }
            handle_error(0x24a7ca,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x154e,"num <= len || num == npos");
          }
          sVar6 = pos;
          if (pos == 0xffffffffffffffff) {
            sVar6 = this->len;
          }
          basic_substring(&local_40,this->str,sVar6);
          unaff_R15 = local_40.len;
          local_50 = local_40.str;
        }
        else {
          unaff_R15 = 0;
          local_50 = this->str;
        }
      }
    }
    if (iVar9 != 0) {
      if (iVar9 == 6) goto LAB_001dbaec;
      goto LAB_001dbabd;
    }
  }
LAB_001dbd98:
  local_50 = this->str;
  unaff_R15 = 0;
  if (bVar4 || bVar3) {
    unaff_R15 = uVar10;
  }
  goto LAB_001dbabd;
LAB_001dbaec:
  if (pos == 0) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      bVar11 = (basic_substring<const_char>)(*pcVar2)();
      return bVar11;
    }
    handle_error(0x24a7ca,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x195a,"pos > 0");
  }
  if ((this->str[pos - 1] & 0xdfU) != 0x50) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      bVar11 = (basic_substring<const_char>)(*pcVar2)();
      return bVar11;
    }
    handle_error(0x24a7ca,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x195b,"str[pos - 1] == \'p\' || str[pos - 1] == \'P\'");
  }
  uVar10 = pos + 1;
  if ((uVar10 < this->len) &&
     (((this->str[pos] == '-' || (this->str[pos] == '+')) && ((bool)(bVar4 | bVar3))))) {
    uVar8 = this->len;
    if (uVar10 < uVar8) {
      bVar4 = false;
      do {
        bVar1 = this->str[uVar10];
        bVar3 = true;
        if (9 < (byte)(bVar1 - 0x30)) {
          bVar3 = bVar4;
          if ((bVar4) &&
             (((bVar1 < 0x3c && ((0x800120100002601U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)) ||
              ((bVar1 == 0x7d || (bVar1 == 0x5d)))))) {
            if (uVar8 < uVar10) {
              eVar5 = get_error_flags();
              if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
                pcVar2 = (code *)swi(3);
                bVar11 = (basic_substring<const_char>)(*pcVar2)();
                return bVar11;
              }
              handle_error(0x24a7ca,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x154e,"num <= len || num == npos");
            }
            basic_substring(&local_40,this->str,uVar10);
            local_50 = local_40.str;
            unaff_R15 = local_40.len;
          }
          else {
            unaff_R15 = 0;
            local_50 = this->str;
          }
        }
        bVar4 = bVar3;
        if (9 < (byte)(bVar1 - 0x30)) goto LAB_001dbabd;
        uVar10 = uVar10 + 1;
        uVar8 = this->len;
      } while (uVar10 < uVar8);
    }
    local_50 = this->str;
    unaff_R15 = uVar8;
  }
  else {
    local_50 = this->str;
    unaff_R15 = 0;
  }
LAB_001dbabd:
  bVar11.len = unaff_R15;
  bVar11.str = local_50;
  return bVar11;
}

Assistant:

C4_NO_INLINE C4_PURE basic_substring _first_real_span_hex(size_t pos) const noexcept
    {
        bool intchars = false;
        bool fracchars = false;
        bool powchars;
        // integral part
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(_is_hex_char(c))
            {
                intchars = true;
            }
            else if(c == '.')
            {
                ++pos;
                goto fractional_part_hex;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_hex;
            }
            else if(_is_delim_char(c))
            {
                return intchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        // no . or p were found; this is either an integral number
        // or not a number at all
        return intchars ?
            *this :
            first(0);
    fractional_part_hex:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == '.');
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(_is_hex_char(c))
            {
                fracchars = true;
            }
            else if(c == 'p' || c == 'P')
            {
                ++pos;
                goto power_part_hex;
            }
            else if(_is_delim_char(c))
            {
                return intchars || fracchars ? first(pos) : first(0);
            }
            else
            {
                return first(0);
            }
        }
        return intchars || fracchars ?
            *this :
            first(0);
    power_part_hex:
        C4_ASSERT(pos > 0);
        C4_ASSERT(str[pos - 1] == 'p' || str[pos - 1] == 'P');
        // either a + or a - is expected here, followed by more chars.
        // also, using (pos+1) in this check will cause an early
        // return when no more chars follow the sign.
        if(len <= (pos+1) || (str[pos] != '+' && str[pos] != '-') || ((!intchars) && (!fracchars)))
            return first(0);
        ++pos; // this was the sign.
        // ... so the (pos+1) ensures that we enter the loop and
        // hence that there exist chars in the power part
        powchars = false;
        for( ; pos < len; ++pos)
        {
            const char c = str[pos];
            if(c >= '0' && c <= '9')
                powchars = true;
            else if(powchars && _is_delim_char(c))
                return first(pos);
            else
                return first(0);
        }
        return *this;
    }